

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CMoveStatement *statement)

{
  CExpression *pCVar1;
  CEseqExpression *this_00;
  long lVar2;
  CMoveStatement *pCVar3;
  CStatement *pCVar4;
  CExpression *pCVar5;
  INode IVar6;
  CSeqStatement *pCVar7;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> sourceEseq;
  pointer *__ptr;
  pointer_____offset_0x10___ *target;
  undefined1 local_88 [16];
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  CSeqStatement *local_38;
  
  pCVar1 = CMoveStatement::Target(statement);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  sourceEseq._M_head_impl =
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar1 = CMoveStatement::Source(statement);
  target = (pointer_____offset_0x10___ *)this;
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1);
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if ((CEseqExpression *)sourceEseq._M_head_impl == (CEseqExpression *)0x0) {
    this_00 = (CEseqExpression *)0x0;
  }
  else {
    target = &CExpression::typeinfo;
    this_00 = (CEseqExpression *)
              __dynamic_cast(sourceEseq._M_head_impl,&CExpression::typeinfo,
                             &CEseqExpression::typeinfo,0);
  }
  if (pCVar1 == (CExpression *)0x0) {
    lVar2 = 0;
  }
  else {
    target = &CExpression::typeinfo;
    lVar2 = __dynamic_cast(pCVar1,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (this_00 == (CEseqExpression *)0x0 && lVar2 == 0) {
    pCVar3 = (CMoveStatement *)operator_new(0x18);
    local_48._M_head_impl = pCVar1;
    local_40._M_head_impl = sourceEseq._M_head_impl;
    CMoveStatement::CMoveStatement
              (pCVar3,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_40,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_48);
    pCVar4 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar3;
    if (pCVar4 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar4->super_IStatement).super_INode + 0x10))();
    }
    if (local_48._M_head_impl != (CExpression *)0x0) {
      (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_48._M_head_impl = (CExpression *)0x0;
    sourceEseq._M_head_impl = local_40._M_head_impl;
    goto LAB_00130973;
  }
  if ((this_00 == (CEseqExpression *)0x0) && (lVar2 != 0)) {
    processSourceEseqInCMove
              ((CEseqFloatVisitor *)local_88,(CExpression *)target,
               (CEseqExpression *)sourceEseq._M_head_impl);
    pCVar5 = (CExpression *)
             (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (CStatement *)local_88._0_8_;
LAB_0013082b:
    if (pCVar5 != (CExpression *)0x0) {
      (*(pCVar5->super_IExpression).super_INode._vptr_INode[2])();
    }
LAB_00130836:
    if (pCVar1 == (CExpression *)0x0) goto LAB_00130973;
    IVar6._vptr_INode = (pCVar1->super_IExpression).super_INode._vptr_INode;
  }
  else {
    if ((this_00 == (CEseqExpression *)0x0) || (lVar2 != 0)) {
      if ((this_00 != (CEseqExpression *)0x0) && (lVar2 != 0)) {
        pCVar7 = (CSeqStatement *)operator_new(0x18);
        pCVar5 = (CExpression *)CEseqExpression::getStatement(this_00);
        (*(((IStatement *)&pCVar5->super_IExpression)->super_INode)._vptr_INode[3])(local_88);
        local_78._M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
             (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
             (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
             local_88._0_8_;
        local_88._0_8_ = (CExpression *)0x0;
        processSourceEseqInCMove
                  ((CEseqFloatVisitor *)(local_88 + 8),pCVar5,
                   (CEseqExpression *)sourceEseq._M_head_impl);
        local_68._M_head_impl = (CExpressionList *)local_88._8_8_;
        CSeqStatement::CSeqStatement
                  (pCVar7,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                           *)&local_78,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_68);
        pCVar4 = (this->childStatement)._M_t.
                 super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                 .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
        (this->childStatement)._M_t.
        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar7;
        if (pCVar4 != (CStatement *)0x0) {
          (**(code **)((long)(pCVar4->super_IStatement).super_INode + 0x10))();
        }
        if (local_68._M_head_impl != (CExpressionList *)0x0) {
          (*(((IStatement *)&(local_68._M_head_impl)->super_IExpression)->super_INode)._vptr_INode
            [2])();
        }
        local_68._M_head_impl = (CExpressionList *)0x0;
        if (local_78._M_t.
            super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
            .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             )0x0) {
          (**(code **)((long)*(IExpression *)
                              local_78._M_t.
                              super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                              .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x10))();
        }
        local_78._M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
             (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
             (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
              )0x0;
        pCVar5 = (CExpression *)local_88._0_8_;
        goto LAB_0013082b;
      }
      goto LAB_00130836;
    }
    local_38 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = CEseqExpression::getStatement(this_00);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(local_88,pCVar4);
    local_70._M_head_impl = (CExpressionList *)local_88._0_8_;
    local_88._0_8_ = (CExpression *)0x0;
    pCVar3 = (CMoveStatement *)operator_new(0x18);
    pCVar5 = CEseqExpression::getExpression(this_00);
    (*(pCVar5->super_IExpression).super_INode._vptr_INode[3])(local_88 + 8,pCVar5);
    local_58._M_head_impl = (CExpression *)local_88._8_8_;
    local_88._8_8_ =
         (__uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>)0x0;
    local_60._M_head_impl = pCVar1;
    CMoveStatement::CMoveStatement
              (pCVar3,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_58,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_60);
    pCVar7 = local_38;
    local_50._M_head_impl = (CStatement *)pCVar3;
    CSeqStatement::CSeqStatement
              (local_38,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_70,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_50);
    pCVar4 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = &pCVar7->super_CStatement;
    if (pCVar4 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar4->super_IStatement).super_INode + 0x10))();
    }
    if ((CMoveStatement *)local_50._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_50._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_50._M_head_impl = (CStatement *)0x0;
    if (local_60._M_head_impl != (CExpression *)0x0) {
      (*((local_60._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_60._M_head_impl = (CExpression *)0x0;
    if (local_58._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_58._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])()
      ;
    }
    local_58._M_head_impl = (CExpression *)0x0;
    if ((_Head_base<0UL,_const_IRT::CStatement_*,_false>)local_88._8_8_ !=
        (_Head_base<0UL,_const_IRT::CStatement_*,_false>)0x0) {
      (*(((IStatement *)local_88._8_8_)->super_INode)._vptr_INode[2])();
    }
    if (local_70._M_head_impl != (CExpressionList *)0x0) {
      (*((local_70._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CExpressionList *)0x0;
    if ((CExpression *)local_88._0_8_ == (CExpression *)0x0) goto LAB_00130973;
    IVar6._vptr_INode = *(_func_int ***)local_88._0_8_;
    pCVar1 = (CExpression *)local_88._0_8_;
  }
  (**(code **)((long)IVar6._vptr_INode + 0x10))(pCVar1);
LAB_00130973:
  if ((CEseqExpression *)sourceEseq._M_head_impl != (CEseqExpression *)0x0) {
    (*(((CEseqExpression *)sourceEseq._M_head_impl)->super_CExpression).super_IExpression.
      super_INode._vptr_INode[2])(sourceEseq._M_head_impl);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CMoveStatement &statement) {
    statement.Target()->Accept(*this);
    std::unique_ptr<const CExpression> target = std::move(childExpression);

    statement.Source()->Accept(*this);
    std::unique_ptr<const CExpression> source = std::move(childExpression);

    const CEseqExpression* targetEseq = dynamic_cast<const CEseqExpression*>(target.get());
    const CEseqExpression* sourceEseq = dynamic_cast<const CEseqExpression*>(source.get());

    if (targetEseq == nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CMoveStatement(
                std::move(target),
                std::move(source)
        ));

        return;
    }

    if (targetEseq == nullptr && sourceEseq != nullptr) {
        childStatement = std::move(processSourceEseqInCMove(target.get(), sourceEseq));

        return;
    }

    if (targetEseq != nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CMoveStatement(
                        std::move(targetEseq->getExpression()->Copy()),
                        std::move(source)
                ))
        ));

        return;
    }

    if (targetEseq != nullptr && sourceEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                std::move(processSourceEseqInCMove(target.get(), sourceEseq))
        ));

        return;
    }
}